

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_events.cpp
# Opt level: O0

void kokkosp_allocate_data(SpaceHandle space,char *label,void *ptr,uint64_t size)

{
  SpaceHandle space_00;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  uint64_t local_20;
  uint64_t size_local;
  void *ptr_local;
  char *label_local;
  
  local_20 = size;
  size_local = (uint64_t)ptr;
  ptr_local = label;
  memcpy(&local_60,&space,0x40);
  space_00.name[8] = (undefined1)uStack_58;
  space_00.name[9] = uStack_58._1_1_;
  space_00.name[10] = uStack_58._2_1_;
  space_00.name[0xb] = uStack_58._3_1_;
  space_00.name[0xc] = uStack_58._4_1_;
  space_00.name[0xd] = uStack_58._5_1_;
  space_00.name[0xe] = uStack_58._6_1_;
  space_00.name[0xf] = uStack_58._7_1_;
  space_00.name[0] = (undefined1)local_60;
  space_00.name[1] = local_60._1_1_;
  space_00.name[2] = local_60._2_1_;
  space_00.name[3] = local_60._3_1_;
  space_00.name[4] = local_60._4_1_;
  space_00.name[5] = local_60._5_1_;
  space_00.name[6] = local_60._6_1_;
  space_00.name[7] = local_60._7_1_;
  space_00.name[0x10] = (undefined1)local_50;
  space_00.name[0x11] = local_50._1_1_;
  space_00.name[0x12] = local_50._2_1_;
  space_00.name[0x13] = local_50._3_1_;
  space_00.name[0x14] = local_50._4_1_;
  space_00.name[0x15] = local_50._5_1_;
  space_00.name[0x16] = local_50._6_1_;
  space_00.name[0x17] = local_50._7_1_;
  space_00.name[0x18] = (undefined1)uStack_48;
  space_00.name[0x19] = uStack_48._1_1_;
  space_00.name[0x1a] = uStack_48._2_1_;
  space_00.name[0x1b] = uStack_48._3_1_;
  space_00.name[0x1c] = uStack_48._4_1_;
  space_00.name[0x1d] = uStack_48._5_1_;
  space_00.name[0x1e] = uStack_48._6_1_;
  space_00.name[0x1f] = uStack_48._7_1_;
  space_00.name[0x20] = (undefined1)local_40;
  space_00.name[0x21] = local_40._1_1_;
  space_00.name[0x22] = local_40._2_1_;
  space_00.name[0x23] = local_40._3_1_;
  space_00.name[0x24] = local_40._4_1_;
  space_00.name[0x25] = local_40._5_1_;
  space_00.name[0x26] = local_40._6_1_;
  space_00.name[0x27] = local_40._7_1_;
  space_00.name[0x28] = (undefined1)uStack_38;
  space_00.name[0x29] = uStack_38._1_1_;
  space_00.name[0x2a] = uStack_38._2_1_;
  space_00.name[0x2b] = uStack_38._3_1_;
  space_00.name[0x2c] = uStack_38._4_1_;
  space_00.name[0x2d] = uStack_38._5_1_;
  space_00.name[0x2e] = uStack_38._6_1_;
  space_00.name[0x2f] = uStack_38._7_1_;
  space_00.name[0x30] = (undefined1)local_30;
  space_00.name[0x31] = local_30._1_1_;
  space_00.name[0x32] = local_30._2_1_;
  space_00.name[0x33] = local_30._3_1_;
  space_00.name[0x34] = local_30._4_1_;
  space_00.name[0x35] = local_30._5_1_;
  space_00.name[0x36] = local_30._6_1_;
  space_00.name[0x37] = local_30._7_1_;
  space_00.name[0x38] = (undefined1)uStack_28;
  space_00.name[0x39] = uStack_28._1_1_;
  space_00.name[0x3a] = uStack_28._2_1_;
  space_00.name[0x3b] = uStack_28._3_1_;
  space_00.name[0x3c] = uStack_28._4_1_;
  space_00.name[0x3d] = uStack_28._5_1_;
  space_00.name[0x3e] = uStack_28._6_1_;
  space_00.name[0x3f] = uStack_28._7_1_;
  KokkosTools::MemoryEvents::kokkosp_allocate_data
            (space_00,(char *)ptr_local,(void *)size_local,local_20);
  return;
}

Assistant:

void kokkosp_allocate_data(const SpaceHandle space, const char* label,
                           const void* const ptr, const uint64_t size) {
  std::lock_guard<std::mutex> lock(m);

  double time = timer.seconds();

  int space_i = num_spaces;
  for (int s = 0; s < num_spaces; s++)
    if (strcmp(space_name[s], space.name) == 0) space_i = s;

  if (space_i == num_spaces) {
    strncpy(space_name[num_spaces], space.name, 64);
    num_spaces++;
  }
  space_size[space_i] += size;
  space_size_track[space_i].push_back(
      std::make_tuple(time, space_size[space_i], max_mem_usage()));

  events.push_back(
      EventRecord(ptr, size, MEMOP_ALLOCATE, space_i, time, label));
}